

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O3

void lgx_bc_echo(uint n,uint i)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar5;
  ulong uVar4;
  char *pcVar6;
  char *pcVar7;
  
  if (0x30 < (byte)i) {
    pcVar6 = "UNKNOWN";
LAB_0011fe3c:
    printf("%4d %11s\n",n,pcVar6);
    return;
  }
  uVar2 = (ulong)i & 0xff;
  bVar5 = (byte)(i >> 8);
  switch(uVar2) {
  case 0:
  case 0x30:
    pcVar6 = op_name[uVar2];
    goto LAB_0011fe3c;
  case 1:
    uVar1 = (uint)bVar5;
    uVar3 = i >> 0x10;
    pcVar7 = "%4d %11s R[%d] C[%d]\n";
    pcVar6 = op_name[1];
    break;
  case 2:
  case 0xc:
  case 0x14:
  case 0x1d:
  case 0x1e:
  case 0x23:
  case 0x24:
    uVar1 = i >> 8 & 0xff;
    uVar3 = i >> 0x10 & 0xff;
    pcVar7 = "%4d %11s R[%d] R[%d]\n";
    pcVar6 = op_name[uVar2];
    break;
  case 3:
  case 0x1f:
    uVar1 = (uint)bVar5;
    uVar3 = i >> 0x10;
    pcVar7 = "%4d %11s R[%d] %d\n";
    pcVar6 = op_name[uVar2];
    break;
  default:
    pcVar6 = op_name[uVar2];
    pcVar7 = "%4d %11s R[%d] R[%d] R[%d]\n";
    goto LAB_0011fd48;
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xe:
  case 0x10:
  case 0x16:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1c:
    pcVar6 = op_name[uVar2];
    pcVar7 = "%4d %11s R[%d] R[%d] %d\n";
LAB_0011fd48:
    printf(pcVar7,n,pcVar6,(ulong)(i >> 8 & 0xff),(ulong)(i >> 0x10 & 0xff),(ulong)(i >> 0x18));
    return;
  case 0x20:
  case 0x22:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x2d:
  case 0x2f:
    uVar4 = (ulong)bVar5;
    pcVar7 = "%4d %11s R[%d]\n";
    pcVar6 = op_name[uVar2];
    goto LAB_0011fd6c;
  case 0x21:
    uVar4 = (ulong)(i >> 8);
    pcVar7 = "%4d %11s %d\n";
    pcVar6 = op_name[0x21];
LAB_0011fd6c:
    printf(pcVar7,n,pcVar6,uVar4);
    return;
  case 0x2b:
  case 0x2c:
    uVar1 = i >> 8 & 0xff;
    uVar3 = i >> 0x10 & 0xff;
    pcVar7 = "%4d %11s R[%d] G[%d]\n";
    pcVar6 = op_name[uVar2];
  }
  printf(pcVar7,n,pcVar6,(ulong)uVar1,(ulong)uVar3);
  return;
}

Assistant:

void lgx_bc_echo(unsigned n, unsigned i) {
    switch(OP(i)) {
        case OP_ADD:
        case OP_SUB:
        case OP_MUL:
        case OP_DIV:
        case OP_EQ:
        case OP_LE:
        case OP_LT:
        case OP_SHL:
        case OP_SHR:
        case OP_AND:
        case OP_OR:
        case OP_XOR:
        case OP_ARRAY_GET:
        case OP_ARRAY_SET:
        case OP_CONCAT:
            printf("%4d %11s R[%d] R[%d] R[%d]\n", n, op_name[OP(i)], PA(i), PB(i), PC(i));
            break;
        case OP_ADDI:
        case OP_SUBI:
        case OP_MULI:
        case OP_DIVI:
        case OP_EQI:
        case OP_GEI:
        case OP_LEI:
        case OP_GTI:
        case OP_LTI:
        case OP_SHLI:
        case OP_SHRI:
            printf("%4d %11s R[%d] R[%d] %d\n", n, op_name[OP(i)], PA(i), PB(i), PC(i));
            break;
        case OP_MOV:
        case OP_NEG:
        case OP_NOT:
        case OP_LNOT:
        case OP_CALL_SET:
        case OP_TYPEOF:
        case OP_CALL:
            printf("%4d %11s R[%d] R[%d]\n", n, op_name[OP(i)], PA(i), PB(i));
            break;
        case OP_GLOBAL_GET:
        case OP_GLOBAL_SET:
            printf("%4d %11s R[%d] G[%d]\n", n, op_name[OP(i)], PA(i), PB(i));
            break;
        case OP_LOAD:
            printf("%4d %11s R[%d] C[%d]\n", n, op_name[OP(i)], PA(i), PD(i));
            break;
        case OP_MOVI:
        case OP_TEST:
            printf("%4d %11s R[%d] %d\n", n, op_name[OP(i)], PA(i), PD(i));
            break;
        case OP_JMP:
        case OP_ARRAY_NEW:
        case OP_RET:
        case OP_CALL_NEW:
        case OP_THROW:
        case OP_TAIL_CALL:
        case OP_CO_CALL:
        case OP_ECHO:
            printf("%4d %11s R[%d]\n", n, op_name[OP(i)], PA(i));
            break;
        case OP_JMPI:
            printf("%4d %11s %d\n", n, op_name[OP(i)], PE(i));
            break;
        case OP_NOP:
        case OP_HLT:
            printf("%4d %11s\n", n, op_name[OP(i)]);
            break;
        default:
            printf("%4d %11s\n", n, "UNKNOWN");
    }
}